

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pBufferDataUploadTests.cpp
# Opt level: O2

void __thiscall
deqp::gles3::Performance::anon_unknown_1::
GenericUploadRenderTimeCase<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>
::runSample(GenericUploadRenderTimeCase<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>
            *this,SampleResult *sample)

{
  int iVar1;
  DrawMethod DVar2;
  BufferState BVar3;
  UploadRange UVar4;
  UploadMethod UVar5;
  RenderContext *context;
  char cVar6;
  int iVar7;
  deUint32 err;
  int iVar8;
  undefined4 extraout_var;
  deUint64 dVar10;
  void *__dest;
  deUint64 dVar11;
  Exception *this_00;
  undefined8 *puVar12;
  undefined8 uVar13;
  uint uVar14;
  long lVar15;
  pointer __src;
  allocator<char> local_101;
  long local_100;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> vertexData;
  vector<unsigned_int,_std::allocator<unsigned_int>_> indexData;
  Buffer vertexCopyBuffer;
  Buffer arrayBuffer;
  Surface resultSurface;
  Buffer unrelatedBuffer;
  Buffer indexBuffer;
  long lVar9;
  
  iVar7 = (*((this->
             super_RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>
             ).super_RenderPerformanceTestBase.super_TestCase.m_context)->m_renderCtx->
            _vptr_RenderContext[3])();
  lVar9 = CONCAT44(extraout_var,iVar7);
  glu::TypedObjectWrapper<(glu::ObjectType)1>::TypedObjectWrapper
            (&arrayBuffer,
             ((this->
              super_RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>
              ).super_RenderPerformanceTestBase.super_TestCase.m_context)->m_renderCtx);
  glu::TypedObjectWrapper<(glu::ObjectType)1>::TypedObjectWrapper
            (&indexBuffer,
             ((this->
              super_RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>
              ).super_RenderPerformanceTestBase.super_TestCase.m_context)->m_renderCtx);
  glu::TypedObjectWrapper<(glu::ObjectType)1>::TypedObjectWrapper
            (&unrelatedBuffer,
             ((this->
              super_RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>
              ).super_RenderPerformanceTestBase.super_TestCase.m_context)->m_renderCtx);
  iVar7 = (sample->scene).gridWidth;
  iVar8 = (sample->scene).gridHeight;
  iVar1 = (sample->scene).gridLayers;
  tcu::Surface::Surface(&resultSurface,0x80,0x80);
  vertexData.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  vertexData.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  vertexData.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  indexData.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  indexData.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  indexData.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  generateLayeredGridVertexAttribData4C4V(&vertexData,&sample->scene);
  if ((this->
      super_RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>).
      m_drawMethod == DRAWMETHOD_DRAW_ELEMENTS) {
    generateLayeredGridIndexData(&indexData,&sample->scene);
  }
  (**(code **)(lVar9 + 0x40))(0x8892,arrayBuffer.super_ObjectWrapper.m_object);
  (**(code **)(lVar9 + 0x40))(0x8893,indexBuffer.super_ObjectWrapper.m_object);
  RenderPerformanceTestBase::setupVertexAttribs((RenderPerformanceTestBase *)this);
  iVar7 = iVar7 * iVar8 * iVar1 * 6;
  DVar2 = (this->
          super_RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>
          ).m_drawMethod;
  BVar3 = this->m_bufferState;
  uVar13 = 0x88e8;
  if (DVar2 == DRAWMETHOD_DRAW_ARRAYS && (BVar3 ^ BUFFERSTATE_EXISTING) == BUFFERSTATE_NEW) {
LAB_0119a489:
    (**(code **)(lVar9 + 0x150))
              (0x8892,(long)vertexData.
                            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)vertexData.
                            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                            ._M_impl.super__Vector_impl_data._M_start,
               vertexData.
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_start,uVar13);
    (**(code **)(lVar9 + 0x538))(4,0,iVar7);
  }
  else if (DVar2 != DRAWMETHOD_DRAW_ARRAYS || BVar3 != BUFFERSTATE_NEW) {
    if ((BVar3 ^ BUFFERSTATE_EXISTING) == BUFFERSTATE_NEW &&
        (DVar2 ^ DRAWMETHOD_DRAW_ELEMENTS) == DRAWMETHOD_DRAW_ARRAYS) {
      iVar8 = *(int *)&(this->
                       super_RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>
                       ).field_0xcc;
      (**(code **)(lVar9 + 0x150))
                (0x8892,(long)vertexData.
                              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)vertexData.
                              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                              ._M_impl.super__Vector_impl_data._M_start,
                 vertexData.
                 super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
                 _M_impl.super__Vector_impl_data._M_start,(uint)(iVar8 == 0) * 4 + 0x88e4);
      (**(code **)(lVar9 + 0x150))
                (0x8893,(long)indexData.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                        (long)indexData.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                 indexData.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start,(uint)(iVar8 == 1) * 4 + 0x88e4);
      (**(code **)(lVar9 + 0x568))(4,iVar7,0x1405,0);
    }
    else if ((DVar2 ^ DRAWMETHOD_DRAW_ELEMENTS) == DRAWMETHOD_DRAW_ARRAYS &&
             BVar3 == BUFFERSTATE_NEW) {
      iVar8 = *(int *)&(this->
                       super_RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>
                       ).field_0xcc;
      if (iVar8 == 1) {
        uVar13 = 0x88e4;
        goto LAB_0119a489;
      }
      if (iVar8 == 0) {
        glu::TypedObjectWrapper<(glu::ObjectType)1>::TypedObjectWrapper
                  (&vertexCopyBuffer,
                   ((this->
                    super_RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>
                    ).super_RenderPerformanceTestBase.super_TestCase.m_context)->m_renderCtx);
        (**(code **)(lVar9 + 0x40))(0x8892,vertexCopyBuffer.super_ObjectWrapper.m_object);
        RenderPerformanceTestBase::setupVertexAttribs((RenderPerformanceTestBase *)this);
        (**(code **)(lVar9 + 0x150))
                  (0x8892,(long)vertexData.
                                super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                          (long)vertexData.
                                super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                ._M_impl.super__Vector_impl_data._M_start,
                   vertexData.
                   super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                   ._M_impl.super__Vector_impl_data._M_start,0x88e4);
        (**(code **)(lVar9 + 0x150))
                  (0x8893,(long)indexData.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                          (long)indexData.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start,
                   indexData.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                   .super__Vector_impl_data._M_start,0x88e4);
        (**(code **)(lVar9 + 0x568))(4,iVar7,0x1405,0);
        (**(code **)(lVar9 + 0x40))(0x8892,arrayBuffer.super_ObjectWrapper.m_object);
        RenderPerformanceTestBase::setupVertexAttribs((RenderPerformanceTestBase *)this);
        glu::ObjectWrapper::~ObjectWrapper(&vertexCopyBuffer.super_ObjectWrapper);
      }
    }
  }
  RenderPerformanceTestBase::waitGLResults((RenderPerformanceTestBase *)this);
  err = (**(code **)(lVar9 + 0x800))();
  glu::checkError(err,"post buffer prepare",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/performance/es3pBufferDataUploadTests.cpp"
                  ,0x1323);
  (**(code **)(lVar9 + 0x1c0))(0,0,0,0x3f800000);
  (**(code **)(lVar9 + 0x188))(0x4000);
  RenderPerformanceTestBase::waitGLResults((RenderPerformanceTestBase *)this);
  tcu::warmupCPU();
  uVar14 = *(uint *)&(this->
                     super_RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>
                     ).field_0xcc;
  UVar4 = this->m_uploadRange;
  if (uVar14 == 0 && UVar4 == UPLOADRANGE_FULL) {
    lVar15 = (long)vertexData.
                   super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)vertexData.
                   super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
    uVar13 = 0x8892;
    __src = vertexData.
            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
            _M_impl.super__Vector_impl_data._M_start;
LAB_0119a68e:
    local_100 = 0;
  }
  else {
    if ((uVar14 ^ 1) == 0 && UVar4 == UPLOADRANGE_FULL) {
      lVar15 = (long)indexData.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)indexData.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_start;
      uVar13 = 0x8893;
      __src = (pointer)indexData.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_start;
      goto LAB_0119a68e;
    }
    if (uVar14 == 0 && (UVar4 ^ UPLOADRANGE_PARTIAL) == UPLOADRANGE_FULL) {
      iVar8 = (int)vertexData.
                   super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
              (int)vertexData.
                   super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
      lVar15 = (long)(int)(iVar8 >> 1 & 0xfffffff8);
      local_100 = (long)(int)(iVar8 >> 2 & 0xfffffffc);
      __src = (pointer)((long)(vertexData.
                               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->m_data + local_100);
      uVar13 = 0x8892;
    }
    else {
      if ((uVar14 ^ 1) != 0 || (UVar4 ^ UPLOADRANGE_PARTIAL) != UPLOADRANGE_FULL) goto LAB_0119a897;
      uVar14 = ((int)indexData.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
                (int)indexData.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_start >> 1 & 0xfffffffeU) + 3 & 0xfffffffc;
      lVar15 = (long)(int)uVar14;
      local_100 = (long)(int)(((int)uVar14 >> 1) + 3U & 0xfffffffc);
      __src = (pointer)((long)indexData.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start + local_100);
      uVar13 = 0x8893;
    }
  }
  dVar10 = deGetMicroseconds();
  UVar5 = this->m_uploadMethod;
  if (UVar5 == UPLOADMETHOD_MAP_BUFFER_RANGE) {
    if (this->m_bufferState == BUFFERSTATE_NEW) {
      (**(code **)(lVar9 + 0x150))(uVar13,lVar15,0,0x88e8);
    }
    __dest = (void *)(**(code **)(lVar9 + 0xd00))(uVar13,local_100,lVar15,0x2e);
    if (__dest == (void *)0x0) {
      this_00 = (Exception *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&vertexCopyBuffer,"MapBufferRange returned NULL",&local_101);
      tcu::Exception::Exception(this_00,(string *)&vertexCopyBuffer);
      __cxa_throw(this_00,&tcu::Exception::typeinfo,tcu::Exception::~Exception);
    }
    memcpy(__dest,__src,(long)(int)lVar15);
    cVar6 = (**(code **)(lVar9 + 0x1670))(uVar13);
    if (cVar6 == '\0') {
      puVar12 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar12 = &PTR__exception_01e4a2b8;
      __cxa_throw(puVar12,&Performance::(anonymous_namespace)::UnmapFailureError::typeinfo,
                  std::exception::~exception);
    }
  }
  else if (UVar5 == UPLOADMETHOD_BUFFER_SUB_DATA) {
    if (this->m_bufferState == BUFFERSTATE_NEW) {
      (**(code **)(lVar9 + 0x150))(uVar13,lVar15,0,0x88e8);
    }
    (**(code **)(lVar9 + 0x168))(uVar13,local_100,lVar15,__src);
  }
  else if (UVar5 == UPLOADMETHOD_BUFFER_DATA) {
    (**(code **)(lVar9 + 0x150))(uVar13,lVar15,__src,0x88e8);
  }
  dVar11 = deGetMicroseconds();
  (sample->result).uploadedDataSize = (int)lVar15;
  (sample->result).duration.uploadDuration = dVar11 - dVar10;
  if (this->m_unrelatedBufferType == UNRELATEDBUFFERTYPE_VERTEX) {
    uVar14 = (int)vertexData.
                  super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
             (int)vertexData.
                  super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
    (**(code **)(lVar9 + 0x40))(0x8892,unrelatedBuffer.super_ObjectWrapper.m_object);
    uVar14 = uVar14 & 0xfffffff0;
    (**(code **)(lVar9 + 0x150))
              (0x8892,(long)(int)uVar14,
               vertexData.
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_start,0x88e4);
    (sample->result).unrelatedDataSize = uVar14;
  }
  dVar10 = deGetMicroseconds();
  DVar2 = (this->
          super_RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>
          ).m_drawMethod;
  if (DVar2 == DRAWMETHOD_DRAW_ELEMENTS) {
    (**(code **)(lVar9 + 0x568))(4,iVar7,0x1405,0);
  }
  else if (DVar2 == DRAWMETHOD_DRAW_ARRAYS) {
    (**(code **)(lVar9 + 0x538))(4,0,iVar7);
  }
  dVar11 = deGetMicroseconds();
  (sample->result).duration.renderDuration = dVar11 - dVar10;
  dVar10 = deGetMicroseconds();
  context = ((this->
             super_RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>
             ).super_RenderPerformanceTestBase.super_TestCase.m_context)->m_renderCtx;
  tcu::Surface::getAccess((PixelBufferAccess *)&vertexCopyBuffer,&resultSurface);
  glu::readPixels(context,0,0,(PixelBufferAccess *)&vertexCopyBuffer);
  dVar11 = deGetMicroseconds();
  (sample->result).duration.readDuration = dVar11 - dVar10;
  (sample->result).renderDataSize = (sample->result).numVertices << 5;
  dVar10 = (dVar11 - dVar10) + (sample->result).duration.renderDuration;
  (sample->result).duration.renderReadDuration = dVar10;
  (sample->result).duration.totalDuration = (sample->result).duration.uploadDuration + dVar10;
  (sample->result).duration.fitResponseDuration = dVar10;
LAB_0119a897:
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&indexData.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  std::_Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~_Vector_base
            (&vertexData.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>);
  tcu::Surface::~Surface(&resultSurface);
  glu::ObjectWrapper::~ObjectWrapper(&unrelatedBuffer.super_ObjectWrapper);
  glu::ObjectWrapper::~ObjectWrapper(&indexBuffer.super_ObjectWrapper);
  glu::ObjectWrapper::~ObjectWrapper(&arrayBuffer.super_ObjectWrapper);
  return;
}

Assistant:

void GenericUploadRenderTimeCase<SampleType>::runSample (SampleResult& sample)
{
	const glw::Functions&	gl					= m_context.getRenderContext().getFunctions();
	const glu::Buffer		arrayBuffer			(m_context.getRenderContext());
	const glu::Buffer		indexBuffer			(m_context.getRenderContext());
	const glu::Buffer		unrelatedBuffer		(m_context.getRenderContext());
	const int				numVertices			= getLayeredGridNumVertices(sample.scene);
	tcu::Surface			resultSurface		(RENDER_AREA_SIZE, RENDER_AREA_SIZE);
	deUint64				startTime;
	deUint64				endTime;
	std::vector<tcu::Vec4>	vertexData;
	std::vector<deUint32>	indexData;

	// create data

	generateLayeredGridVertexAttribData4C4V(vertexData, sample.scene);
	if (m_drawMethod == DRAWMETHOD_DRAW_ELEMENTS)
		generateLayeredGridIndexData(indexData, sample.scene);

	gl.bindBuffer(GL_ARRAY_BUFFER, *arrayBuffer);
	gl.bindBuffer(GL_ELEMENT_ARRAY_BUFFER, *indexBuffer);
	RenderCase<SampleType>::setupVertexAttribs();

	// target should be an exisiting buffer? Draw from it once to make sure it exists on the gpu

	if (m_drawMethod == DRAWMETHOD_DRAW_ARRAYS && m_bufferState == BUFFERSTATE_EXISTING)
	{
		gl.bufferData(GL_ARRAY_BUFFER, (glw::GLsizeiptr)(vertexData.size() * sizeof(tcu::Vec4)), &vertexData[0], GL_DYNAMIC_DRAW);
		gl.drawArrays(GL_TRIANGLES, 0, numVertices);
	}
	else if (m_drawMethod == DRAWMETHOD_DRAW_ARRAYS && m_bufferState == BUFFERSTATE_NEW)
	{
		// do not touch the vertex buffer
	}
	else if (m_drawMethod == DRAWMETHOD_DRAW_ELEMENTS && m_bufferState == BUFFERSTATE_EXISTING)
	{
		// hint that the target buffer will be modified soon
		const glw::GLenum vertexDataUsage	= (m_targetBuffer == TARGETBUFFER_VERTEX) ? (GL_DYNAMIC_DRAW) : (GL_STATIC_DRAW);
		const glw::GLenum indexDataUsage	= (m_targetBuffer == TARGETBUFFER_INDEX) ? (GL_DYNAMIC_DRAW) : (GL_STATIC_DRAW);

		gl.bufferData(GL_ARRAY_BUFFER, (glw::GLsizeiptr)(vertexData.size() * sizeof(tcu::Vec4)), &vertexData[0], vertexDataUsage);
		gl.bufferData(GL_ELEMENT_ARRAY_BUFFER, (glw::GLsizeiptr)(indexData.size() * sizeof(deUint32)), &indexData[0], indexDataUsage);
		gl.drawElements(GL_TRIANGLES, numVertices, GL_UNSIGNED_INT, DE_NULL);
	}
	else if (m_drawMethod == DRAWMETHOD_DRAW_ELEMENTS && m_bufferState == BUFFERSTATE_NEW)
	{
		if (m_targetBuffer == TARGETBUFFER_VERTEX)
		{
			// make the index buffer present on the gpu
			// use another vertex buffer to keep original buffer in unused state
			const glu::Buffer vertexCopyBuffer(m_context.getRenderContext());

			gl.bindBuffer(GL_ARRAY_BUFFER, *vertexCopyBuffer);
			RenderCase<SampleType>::setupVertexAttribs();

			gl.bufferData(GL_ARRAY_BUFFER, (glw::GLsizeiptr)(vertexData.size() * sizeof(tcu::Vec4)), &vertexData[0], GL_STATIC_DRAW);
			gl.bufferData(GL_ELEMENT_ARRAY_BUFFER, (glw::GLsizeiptr)(indexData.size() * sizeof(deUint32)), &indexData[0], GL_STATIC_DRAW);
			gl.drawElements(GL_TRIANGLES, numVertices, GL_UNSIGNED_INT, DE_NULL);

			// restore original state
			gl.bindBuffer(GL_ARRAY_BUFFER, *arrayBuffer);
			RenderCase<SampleType>::setupVertexAttribs();
		}
		else if (m_targetBuffer == TARGETBUFFER_INDEX)
		{
			// make the vertex buffer present on the gpu
			gl.bufferData(GL_ARRAY_BUFFER, (glw::GLsizeiptr)(vertexData.size() * sizeof(tcu::Vec4)), &vertexData[0], GL_STATIC_DRAW);
			gl.drawArrays(GL_TRIANGLES, 0, numVertices);
		}
		else
			DE_ASSERT(false);
	}
	else
		DE_ASSERT(false);

	RenderCase<SampleType>::waitGLResults();
	GLU_EXPECT_NO_ERROR(gl.getError(), "post buffer prepare");

	gl.clearColor(0.0f, 0.0f, 0.0f, 1.0f);
	gl.clear(GL_COLOR_BUFFER_BIT);
	RenderCase<SampleType>::waitGLResults();

	tcu::warmupCPU();

	// upload

	{
		glw::GLenum		target;
		glw::GLsizeiptr	size;
		glw::GLintptr	offset = 0;
		const void*		source;

		if (m_targetBuffer == TARGETBUFFER_VERTEX && m_uploadRange == UPLOADRANGE_FULL)
		{
			target	= GL_ARRAY_BUFFER;
			size	= (glw::GLsizeiptr)(vertexData.size() * sizeof(tcu::Vec4));
			source	= &vertexData[0];
		}
		else if (m_targetBuffer == TARGETBUFFER_INDEX && m_uploadRange == UPLOADRANGE_FULL)
		{
			target	= GL_ELEMENT_ARRAY_BUFFER;
			size	= (glw::GLsizeiptr)(indexData.size() * sizeof(deUint32));
			source	= &indexData[0];
		}
		else if (m_targetBuffer == TARGETBUFFER_VERTEX && m_uploadRange == UPLOADRANGE_PARTIAL)
		{
			DE_ASSERT(m_bufferState == BUFFERSTATE_EXISTING);

			target	= GL_ARRAY_BUFFER;
			size	= (glw::GLsizeiptr)deAlign32((int)(vertexData.size() * sizeof(tcu::Vec4)) / 2, 4);
			offset	= (glw::GLintptr)deAlign32((int)size / 2, 4);
			source	= (const deUint8*)&vertexData[0] + offset;
		}
		else if (m_targetBuffer == TARGETBUFFER_INDEX && m_uploadRange == UPLOADRANGE_PARTIAL)
		{
			DE_ASSERT(m_bufferState == BUFFERSTATE_EXISTING);

			// upload to 25% - 75% range
			target	= GL_ELEMENT_ARRAY_BUFFER;
			size	= (glw::GLsizeiptr)deAlign32((deInt32)(indexData.size() * sizeof(deUint32)) / 2, 4);
			offset	= (glw::GLintptr)deAlign32((int)size / 2, 4);
			source	= (const deUint8*)&indexData[0] + offset;
		}
		else
		{
			DE_ASSERT(false);
			return;
		}

		startTime = deGetMicroseconds();

		if (m_uploadMethod == UPLOADMETHOD_BUFFER_DATA)
			gl.bufferData(target, size, source, GL_DYNAMIC_DRAW);
		else if (m_uploadMethod == UPLOADMETHOD_BUFFER_SUB_DATA)
		{
			// create buffer storage
			if (m_bufferState == BUFFERSTATE_NEW)
				gl.bufferData(target, size, DE_NULL, GL_DYNAMIC_DRAW);
			gl.bufferSubData(target, offset, size, source);
		}
		else if (m_uploadMethod == UPLOADMETHOD_MAP_BUFFER_RANGE)
		{
			void*			mapPtr;
			glw::GLboolean	unmapSuccessful;

			// create buffer storage
			if (m_bufferState == BUFFERSTATE_NEW)
				gl.bufferData(target, size, DE_NULL, GL_DYNAMIC_DRAW);

			mapPtr = gl.mapBufferRange(target, offset, size, GL_MAP_WRITE_BIT | GL_MAP_INVALIDATE_RANGE_BIT | GL_MAP_INVALIDATE_BUFFER_BIT | GL_MAP_UNSYNCHRONIZED_BIT);
			if (!mapPtr)
				throw tcu::Exception("MapBufferRange returned NULL");

			deMemcpy(mapPtr, source, (int)size);

			// if unmapping fails, just try again later
			unmapSuccessful = gl.unmapBuffer(target);
			if (!unmapSuccessful)
				throw UnmapFailureError();
		}
		else
			DE_ASSERT(false);

		endTime = deGetMicroseconds();

		sample.result.uploadedDataSize = (int)size;
		sample.result.duration.uploadDuration = endTime - startTime;
	}

	// unrelated
	if (m_unrelatedBufferType == UNRELATEDBUFFERTYPE_VERTEX)
	{
		const int unrelatedUploadSize = (int)(vertexData.size() * sizeof(tcu::Vec4));

		gl.bindBuffer(GL_ARRAY_BUFFER, *unrelatedBuffer);
		gl.bufferData(GL_ARRAY_BUFFER, unrelatedUploadSize, &vertexData[0], GL_STATIC_DRAW);
		// Attibute pointers are not modified, no need restore state

		sample.result.unrelatedDataSize = unrelatedUploadSize;
	}

	// draw
	{
		startTime = deGetMicroseconds();

		if (m_drawMethod == DRAWMETHOD_DRAW_ARRAYS)
			gl.drawArrays(GL_TRIANGLES, 0, numVertices);
		else if (m_drawMethod == DRAWMETHOD_DRAW_ELEMENTS)
			gl.drawElements(GL_TRIANGLES, numVertices, GL_UNSIGNED_INT, DE_NULL);
		else
			DE_ASSERT(false);

		endTime = deGetMicroseconds();

		sample.result.duration.renderDuration = endTime - startTime;
	}

	// read
	{
		startTime = deGetMicroseconds();
		glu::readPixels(m_context.getRenderContext(), 0, 0, resultSurface.getAccess());
		endTime = deGetMicroseconds();

		sample.result.duration.readDuration = endTime - startTime;
	}

	// set results

	sample.result.renderDataSize = RenderCase<SampleType>::getVertexDataSize() * sample.result.numVertices;

	sample.result.duration.renderReadDuration = sample.result.duration.renderDuration + sample.result.duration.readDuration;
	sample.result.duration.totalDuration = sample.result.duration.uploadDuration + sample.result.duration.renderDuration + sample.result.duration.readDuration;
	sample.result.duration.fitResponseDuration = sample.result.duration.renderReadDuration;
}